

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

ExprList * sqlite3ExprListAppend(Parse *pParse,ExprList *pList,Expr *pExpr)

{
  char **ppcVar1;
  int iVar2;
  ExprList *pEVar3;
  
  if (pList == (ExprList *)0x0) {
    pEVar3 = sqlite3ExprListAppendNew(pParse->db,pExpr);
    return pEVar3;
  }
  iVar2 = pList->nExpr;
  if (iVar2 < pList->nAlloc) {
    pList->nExpr = iVar2 + 1;
    ppcVar1 = &pList->a[iVar2].zEName;
    *ppcVar1 = (char *)0x0;
    *(undefined8 *)(ppcVar1 + 1) = 0;
    pList->a[iVar2].pExpr = pExpr;
    return pList;
  }
  pEVar3 = sqlite3ExprListAppendGrow(pParse->db,pList,pExpr);
  return pEVar3;
}

Assistant:

SQLITE_PRIVATE ExprList *sqlite3ExprListAppend(
  Parse *pParse,          /* Parsing context */
  ExprList *pList,        /* List to which to append. Might be NULL */
  Expr *pExpr             /* Expression to be appended. Might be NULL */
){
  struct ExprList_item *pItem;
  if( pList==0 ){
    return sqlite3ExprListAppendNew(pParse->db,pExpr);
  }
  if( pList->nAlloc<pList->nExpr+1 ){
    return sqlite3ExprListAppendGrow(pParse->db,pList,pExpr);
  }
  pItem = &pList->a[pList->nExpr++];
  *pItem = zeroItem;
  pItem->pExpr = pExpr;
  return pList;
}